

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

NewClassExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::NewClassExpression,slang::ast::Type_const&,slang::ast::Expression*&,bool&,slang::SourceRange&>
          (BumpAllocator *this,Type *args,Expression **args_1,bool *args_2,SourceRange *args_3)

{
  bool bVar1;
  Expression *pEVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  NewClassExpression *pNVar5;
  
  pNVar5 = (NewClassExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NewClassExpression *)this->endPtr < pNVar5 + 1) {
    pNVar5 = (NewClassExpression *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pNVar5 + 1);
  }
  pEVar2 = *args_1;
  bVar1 = *args_2;
  SVar3 = args_3->startLoc;
  SVar4 = args_3->endLoc;
  (pNVar5->super_Expression).kind = NewClass;
  (pNVar5->super_Expression).type.ptr = args;
  (pNVar5->super_Expression).constant = (ConstantValue *)0x0;
  (pNVar5->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pNVar5->super_Expression).sourceRange.startLoc = SVar3;
  (pNVar5->super_Expression).sourceRange.endLoc = SVar4;
  pNVar5->isSuperClass = bVar1;
  pNVar5->constructorCall_ = pEVar2;
  return pNVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }